

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O0

void test_read_format_zip_ppmd_multi_blockread(void)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  archive_entry *local_20;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_31d3f;
  extract_reference_file("test_read_format_zip_ppmd8_multi.zipx");
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ǐ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_support_format_zip((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ǒ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",ae);
  wVar1 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x25);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ǒ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_open_filename(a, refname, 37)"
                      ,ae);
  iVar2 = archive_read_next_header((archive *)ae,&local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ǔ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_format_name((archive *)ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'Ǖ',"ZIP 6.3 (ppmd-1)","\"ZIP 6.3 (ppmd-1)\"",pcVar3,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(local_20);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ǖ',"smartd.conf","\"smartd.conf\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  iVar2 = extract_one_using_blocks((archive *)ae,0xc,0x8dd7379e);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ǘ',0,"0",(long)iVar2,"extract_one_using_blocks(a, 12, 0x8DD7379E)",ae);
  iVar2 = archive_read_next_header((archive *)ae,&local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ǚ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_format_name((archive *)ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ǚ',"ZIP 6.3 (ppmd-1)","\"ZIP 6.3 (ppmd-1)\"",pcVar3,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(local_20);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'Ǜ',"ts.conf","\"ts.conf\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar2 = extract_one_using_blocks((archive *)ae,0xd,0x7ae59b31);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ǜ',0,"0",(long)iVar2,"extract_one_using_blocks(a, 13, 0x7AE59B31)",ae);
  iVar2 = archive_read_next_header((archive *)ae,&local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ǟ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_format_name((archive *)ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ǟ',"ZIP 6.3 (ppmd-1)","\"ZIP 6.3 (ppmd-1)\"",pcVar3,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(local_20);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'Ǡ',"vimrc","\"vimrc\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  iVar2 = extract_one_using_blocks((archive *)ae,0xe,0xba8e3baa);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ǡ',0,"0",(long)iVar2,"extract_one_using_blocks(a, 14, 0xBA8E3BAA)",ae);
  iVar2 = archive_read_next_header((archive *)ae,&local_20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ǣ',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
  iVar2 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ǥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",ae);
  iVar2 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ǥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",ae);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_ppmd_multi_blockread)
{
	const char *refname = "test_read_format_zip_ppmd8_multi.zipx";
	struct archive *a;
	struct archive_entry *ae;

	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 37));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 6.3 (ppmd-1)", archive_format_name(a));
	assertEqualString("smartd.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one_using_blocks(a, 12, 0x8DD7379E));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 6.3 (ppmd-1)", archive_format_name(a));
	assertEqualString("ts.conf", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one_using_blocks(a, 13, 0x7AE59B31));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 6.3 (ppmd-1)", archive_format_name(a));
	assertEqualString("vimrc", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one_using_blocks(a, 14, 0xBA8E3BAA));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}